

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

wchar_t * fmt::v5::internal::
          parse_format_specs<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>>&>
                    (wchar_t *begin,wchar_t *end,
                    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                    *handler)

{
  char cVar1;
  wchar_t wVar2;
  uint uVar3;
  wchar_t *pwVar4;
  wchar_t *begin_00;
  wchar_t *local_30;
  precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>_&,_wchar_t>
  local_28;
  
  if (begin == end) {
    return begin;
  }
  if (*begin == L'}') {
    return begin;
  }
  pwVar4 = parse_align<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>>&>
                     (begin,end,handler);
  if (pwVar4 == end) {
    return pwVar4;
  }
  cVar1 = (char)*pwVar4;
  if (cVar1 == ' ') {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
    ::on_space(handler);
LAB_0016ee5c:
    pwVar4 = pwVar4 + 1;
  }
  else {
    if (cVar1 == '-') {
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
      ::on_minus(handler);
      goto LAB_0016ee5c;
    }
    if (cVar1 == '+') {
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
      ::on_plus(handler);
      goto LAB_0016ee5c;
    }
  }
  if (pwVar4 == end) {
    return pwVar4;
  }
  wVar2 = *pwVar4;
  if (wVar2 == L'#') {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
    ::on_hash(handler);
    pwVar4 = pwVar4 + 1;
    if (pwVar4 == end) {
      return pwVar4;
    }
    wVar2 = *pwVar4;
  }
  if (wVar2 == L'0') {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
    ::on_zero(handler);
    pwVar4 = pwVar4 + 1;
    if (pwVar4 == end) {
      return pwVar4;
    }
  }
  local_30 = parse_width<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>>&>
                       (pwVar4,end,handler);
  if (local_30 == end) {
    return local_30;
  }
  if (*local_30 == L'.') {
    pwVar4 = local_30 + 1;
    if (pwVar4 == end) {
LAB_0016ef7d:
      local_30 = pwVar4;
      specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
      ::on_error(&handler->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                 ,"missing precision specifier");
      return pwVar4;
    }
    if ((uint)(*pwVar4 + L'\xffffffd0') < 10) {
      local_30 = pwVar4;
      uVar3 = parse_nonnegative_int<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>>&>
                        (&local_30,end,handler);
      (((handler->
        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
        ).super_specs_setter<wchar_t>.specs_)->super_core_format_specs).precision = uVar3;
    }
    else {
      if (*pwVar4 != L'{') goto LAB_0016ef7d;
      begin_00 = local_30 + 2;
      local_30 = pwVar4;
      if (begin_00 != end) {
        local_28.handler = handler;
        begin_00 = parse_arg_id<wchar_t,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>>&,wchar_t>>
                             (begin_00,end,&local_28);
      }
      pwVar4 = begin_00;
      if ((begin_00 == end) || (pwVar4 = begin_00 + 1, local_30 = pwVar4, *begin_00 != L'}')) {
        specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
        ::on_error(&handler->
                    super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                   ,"invalid format string");
        return pwVar4;
      }
    }
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
    ::end_precision(handler);
  }
  if ((local_30 != end) && (wVar2 = *local_30, wVar2 != L'}')) {
    local_30 = local_30 + 1;
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
      ).super_specs_setter<wchar_t>.specs_)->super_core_format_specs).type = (char)wVar2;
  }
  return local_30;
}

Assistant:

FMT_CONSTEXPR const Char *parse_format_specs(
    const Char *begin, const Char *end, SpecHandler &&handler) {
  if (begin == end || *begin == '}')
    return begin;

  begin = parse_align(begin, end, handler);
  if (begin == end) return begin;

  // Parse sign.
  switch (static_cast<char>(*begin)) {
  case '+':
    handler.on_plus();
    ++begin;
    break;
  case '-':
    handler.on_minus();
    ++begin;
    break;
  case ' ':
    handler.on_space();
    ++begin;
    break;
  }
  if (begin == end) return begin;

  if (*begin == '#') {
    handler.on_hash();
    if (++begin == end) return begin;
  }

  // Parse zero flag.
  if (*begin == '0') {
    handler.on_zero();
    if (++begin == end) return begin;
  }

  begin = parse_width(begin, end, handler);
  if (begin == end) return begin;

  // Parse precision.
  if (*begin == '.') {
    ++begin;
    auto c = begin != end ? *begin : 0;
    if ('0' <= c && c <= '9') {
      handler.on_precision(parse_nonnegative_int(begin, end, handler));
    } else if (c == '{') {
      ++begin;
      if (begin != end) {
        begin = parse_arg_id(
              begin, end, precision_adapter<SpecHandler, Char>(handler));
      }
      if (begin == end || *begin++ != '}')
        return handler.on_error("invalid format string"), begin;
    } else {
      return handler.on_error("missing precision specifier"), begin;
    }
    handler.end_precision();
  }

  // Parse type.
  if (begin != end && *begin != '}')
    handler.on_type(*begin++);
  return begin;
}